

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

void P_RunEffect(AActor *actor,int effects)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  particle_t *ppVar13;
  int *piVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  DAngle moveangle;
  DVector3 pos;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  TVector3<double>::Angle((TVector3<double> *)&moveangle);
  if (((effects & 1U) != 0) && (((byte)cl_rockettrails.Value & 1) != 0)) {
    dVar1 = actor->radius;
    dVar4 = fastcosdeg(moveangle.Degrees);
    dVar4 = dVar4 * dVar1 * -2.0;
    dVar1 = actor->radius;
    dVar5 = fastsindeg(moveangle.Degrees);
    dVar16 = ((actor->Vel).Z * -0.125 + 0.6666666666666666) * actor->Height;
    dVar5 = dVar5 * dVar1 * -2.0;
    dVar1 = moveangle.Degrees + 90.0;
    uVar11 = FRandom::operator()(&M_Random);
    ppVar13 = JitterParticle((uVar11 & 0x1f) + 3);
    if (ppVar13 != (particle_t *)0x0) {
      iVar15 = FRandom::operator()(&M_Random);
      dVar17 = (double)iVar15 * 0.00390625;
      AActor::Vec3Offset(&pos,actor,dVar4 - (actor->Vel).X * dVar17,dVar5 - (actor->Vel).Y * dVar17,
                         dVar16 - dVar17 * (actor->Vel).Z,false);
      (ppVar13->Pos).Z = pos.Z;
      (ppVar13->Pos).X = pos.X;
      (ppVar13->Pos).Y = pos.Y;
      iVar15 = FRandom::operator()(&M_Random);
      dVar17 = (double)(iVar15 + -0x80) * 0.005;
      dVar6 = fastcosdeg(dVar1);
      (ppVar13->Vel).X = dVar6 * dVar17 + (ppVar13->Vel).X;
      dVar6 = fastsindeg(dVar1);
      dVar17 = dVar6 * dVar17 + (ppVar13->Vel).Y;
      dVar6 = (ppVar13->Vel).Z + -0.027777777777777776;
      auVar3._8_4_ = SUB84(dVar6,0);
      auVar3._0_8_ = dVar17;
      auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
      (ppVar13->Vel).Y = dVar17;
      (ppVar13->Vel).Z = (double)auVar3._8_8_;
      (ppVar13->Acc).Z = (ppVar13->Acc).Z + -0.05;
      ppVar13->color = yellow;
      ppVar13->size = 2.0;
    }
    for (iVar15 = -6; iVar15 != 0; iVar15 = iVar15 + 1) {
      uVar11 = FRandom::operator()(&M_Random);
      ppVar13 = JitterParticle((uVar11 & 0x1f) + 3);
      if (ppVar13 == (particle_t *)0x0) break;
      iVar10 = FRandom::operator()(&M_Random);
      dVar7 = (double)iVar10 * 0.00390625;
      dVar17 = (actor->Vel).X;
      dVar6 = (actor->Vel).Y;
      dVar2 = (actor->Vel).Z;
      iVar10 = FRandom::operator()(&M_Random);
      AActor::Vec3Offset(&pos,actor,dVar4 - dVar17 * dVar7,dVar5 - dVar6 * dVar7,
                         (double)iVar10 * 0.015625 + (dVar16 - dVar7 * dVar2),false);
      (ppVar13->Pos).Z = pos.Z;
      (ppVar13->Pos).X = pos.X;
      (ppVar13->Pos).Y = pos.Y;
      iVar10 = FRandom::operator()(&M_Random);
      dVar17 = (double)(iVar10 + -0x80) * 0.005;
      dVar6 = fastcosdeg(dVar1);
      (ppVar13->Vel).X = dVar6 * dVar17 + (ppVar13->Vel).X;
      dVar6 = fastsindeg(dVar1);
      (ppVar13->Vel).Y = (ppVar13->Vel).Y + dVar6 * dVar17;
      (ppVar13->Vel).Z = (ppVar13->Vel).Z + 0.0125;
      (ppVar13->Acc).Z = (ppVar13->Acc).Z + 0.025;
      uVar11 = FRandom::operator()(&M_Random);
      piVar14 = &grey2;
      if ((uVar11 & 7) == 0) {
        piVar14 = &grey1;
      }
      ppVar13->color = *piVar14;
      ppVar13->size = 3.0;
    }
  }
  if (((effects & 2U) != 0) && (((byte)cl_rockettrails.Value & 1) != 0)) {
    local_40.Degrees = moveangle.Degrees;
    AActor::Vec3Angle(&pos,actor,actor->radius * -2.0,&local_40,
                      actor->Height * 0.6666666666666666 + (actor->Vel).Z * actor->Height * -0.125,
                      false);
    local_48.Degrees = moveangle.Degrees + 180.0;
    P_DrawSplash2(6,&pos,&local_48,2,2);
  }
  if (((effects & 0x70000U) != 0) && (((byte)level.time & 1) != 0)) {
    uVar12 = (ulong)((effects & 0x70000U) >> 0xc);
    iVar15 = **(int **)((long)P_RunEffect::fountainColors + uVar12);
    iVar10 = **(int **)((long)P_RunEffect::fountainColors + uVar12 + 8);
    ppVar13 = JitterParticle(0x33);
    if (ppVar13 != (particle_t *)0x0) {
      iVar8 = FRandom::operator()(&M_Random);
      dVar1 = actor->radius;
      iVar9 = FRandom::operator()(&M_Random);
      dVar1 = (double)iVar9 * dVar1 * 0.00390625;
      local_38.Degrees = (double)iVar8 * 1.40625;
      AActor::Vec3Angle(&pos,actor,dVar1,&local_38,actor->Height + 1.0,false);
      (ppVar13->Pos).Z = pos.Z;
      (ppVar13->Pos).X = pos.X;
      (ppVar13->Pos).Y = pos.Y;
      (ppVar13->Vel).Z =
           (ppVar13->Vel).Z +
           *(double *)(&DAT_006949e0 + (ulong)(dVar1 < actor->radius * 0.125) * 8);
      (ppVar13->Acc).Z = (ppVar13->Acc).Z + -0.09090909090909091;
      iVar8 = FRandom::operator()(&M_Random);
      if (iVar8 < 0x1e) {
        iVar15 = iVar10;
      }
      ppVar13->size = *(double *)(&DAT_006949f0 + (ulong)(iVar8 < 0x1e) * 8);
      ppVar13->color = iVar15;
    }
  }
  if ((effects & 0x20U) != 0) {
    for (iVar15 = -3; iVar15 != 0; iVar15 = iVar15 + 1) {
      ppVar13 = JitterParticle(0x10);
      if (ppVar13 != (particle_t *)0x0) {
        iVar10 = FRandom::operator()(&M_Random);
        local_50.Degrees = (double)iVar10 * 1.40625;
        AActor::Vec3Angle(&pos,actor,actor->radius,&local_50,0.0,false);
        (ppVar13->Pos).Z = pos.Z;
        (ppVar13->Pos).X = pos.X;
        (ppVar13->Pos).Y = pos.Y;
        uVar11 = FRandom::operator()(&M_Random);
        ppVar13->color = *P_RunEffect::protectColors[uVar11 & 1];
        (ppVar13->Vel).Z = 1.0;
        iVar10 = FRandom::operator()(&M_Random);
        (ppVar13->Acc).Z = (double)iVar10 * 0.001953125;
        ppVar13->size = 1.0;
        iVar10 = FRandom::operator()(&M_Random);
        if (iVar10 < 0x80) {
          (ppVar13->Pos).Z = actor->Height + (ppVar13->Pos).Z;
          (ppVar13->Vel).Z = -(ppVar13->Vel).Z;
          (ppVar13->Acc).Z = -(ppVar13->Acc).Z;
        }
      }
    }
  }
  return;
}

Assistant:

void P_RunEffect (AActor *actor, int effects)
{
	DAngle moveangle = actor->Vel.Angle();

	particle_t *particle;
	int i;

	if ((effects & FX_ROCKET) && (cl_rockettrails & 1))
	{
		// Rocket trail
		double backx = -actor->radius * 2 * moveangle.Cos();
		double backy = -actor->radius * 2 * moveangle.Sin();
		double backz = actor->Height * ((2. / 3) - actor->Vel.Z / 8);

		DAngle an = moveangle + 90.;
		double speed;

		particle = JitterParticle (3 + (M_Random() & 31));
		if (particle) {
			double pathdist = M_Random() / 256.;
			DVector3 pos = actor->Vec3Offset(
				backx - actor->Vel.X * pathdist,
				backy - actor->Vel.Y * pathdist,
				backz - actor->Vel.Z * pathdist);
			particle->Pos = pos;
			speed = (M_Random () - 128) * (1./200);
			particle->Vel.X += speed * an.Cos();
			particle->Vel.Y += speed * an.Sin();
			particle->Vel.Z -= 1./36;
			particle->Acc.Z -= 1./20;
			particle->color = yellow;
			particle->size = 2;
		}
		for (i = 6; i; i--) {
			particle_t *particle = JitterParticle (3 + (M_Random() & 31));
			if (particle) {
				double pathdist = M_Random() / 256.;
				DVector3 pos = actor->Vec3Offset(
					backx - actor->Vel.X * pathdist,
					backy - actor->Vel.Y * pathdist,
					backz - actor->Vel.Z * pathdist + (M_Random() / 64.));
				particle->Pos = pos;

				speed = (M_Random () - 128) * (1./200);
				particle->Vel.X += speed * an.Cos();
				particle->Vel.Y += speed * an.Sin();
				particle->Vel.Z += 1. / 80;
				particle->Acc.Z += 1. / 40;
				if (M_Random () & 7)
					particle->color = grey2;
				else
					particle->color = grey1;
				particle->size = 3;
			} else
				break;
		}
	}
	if ((effects & FX_GRENADE) && (cl_rockettrails & 1))
	{
		// Grenade trail

		DVector3 pos = actor->Vec3Angle(-actor->radius * 2, moveangle, -actor->Height * actor->Vel.Z / 8 + actor->Height * (2. / 3));

		P_DrawSplash2 (6, pos, moveangle + 180, 2, 2);
	}
	if (effects & FX_FOUNTAINMASK)
	{
		// Particle fountain

		static const int *fountainColors[16] = 
			{ &black,	&black,
			  &red,		&red1,
			  &green,	&green1,
			  &blue,	&blue1,
			  &yellow,	&yellow1,
			  &purple,	&purple1,
			  &black,	&grey3,
			  &grey4,	&white
			};
		int color = (effects & FX_FOUNTAINMASK) >> 15;
		MakeFountain (actor, *fountainColors[color], *fountainColors[color+1]);
	}
	if (effects & FX_RESPAWNINVUL)
	{
		// Respawn protection

		static const int *protectColors[2] = { &yellow1, &white };

		for (i = 3; i > 0; i--)
		{
			particle = JitterParticle (16);
			if (particle != NULL)
			{
				DAngle ang = M_Random() * (360 / 256.);
				DVector3 pos = actor->Vec3Angle(actor->radius, ang, 0);
				particle->Pos = pos;
				particle->color = *protectColors[M_Random() & 1];
				particle->Vel.Z = 1;
				particle->Acc.Z = M_Random () / 512.;
				particle->size = 1;
				if (M_Random () < 128)
				{ // make particle fall from top of actor
					particle->Pos.Z += actor->Height;
					particle->Vel.Z = -particle->Vel.Z;
					particle->Acc.Z = -particle->Acc.Z;
				}
			}
		}
	}
}